

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

bool __thiscall cmCTestLaunch::ParseArguments(cmCTestLaunch *this,int argc,char **argv)

{
  string *__lhs;
  char *__s1;
  bool bVar1;
  int iVar2;
  cmCTestLaunch *pcVar3;
  int iVar4;
  int i;
  undefined4 uVar5;
  long lVar6;
  
  __lhs = &this->OptionLanguage;
  uVar5 = 0;
  lVar6 = 1;
  iVar4 = 0;
  do {
    if ((iVar4 != 0) || (argc <= lVar6)) {
      if (iVar4 == 0) {
        this->RealArgC = 0;
        this->RealArgV = (char **)0x0;
        std::operator<<((ostream *)&std::cerr,"No launch/command separator (\'--\') found!\n");
      }
      else {
        iVar2 = argc - iVar4;
        this->RealArgC = iVar2;
        this->RealArgV = argv + iVar4;
        for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
          HandleRealArg(this,this->RealArgV[lVar6]);
          iVar2 = this->RealArgC;
        }
      }
      return iVar4 != 0;
    }
    __s1 = argv[lVar6];
    if (((*__s1 == '-') && (__s1[1] == '-')) && (__s1[2] == '\0')) {
      iVar4 = (int)lVar6 + 1;
    }
    else {
      iVar2 = strcmp(__s1,"--output");
      iVar4 = 0;
      if (iVar2 == 0) {
        uVar5 = 1;
        goto switchD_00172e8c_caseD_7;
      }
      iVar2 = strcmp(__s1,"--source");
      if (iVar2 == 0) {
        uVar5 = 2;
        goto switchD_00172e8c_caseD_7;
      }
      iVar2 = strcmp(__s1,"--language");
      if (iVar2 == 0) {
        uVar5 = 3;
        goto switchD_00172e8c_caseD_7;
      }
      iVar2 = strcmp(__s1,"--target-name");
      if (iVar2 == 0) {
        uVar5 = 4;
        goto switchD_00172e8c_caseD_7;
      }
      iVar2 = strcmp(__s1,"--target-type");
      if (iVar2 == 0) {
        uVar5 = 5;
        goto switchD_00172e8c_caseD_7;
      }
      iVar2 = strcmp(__s1,"--build-dir");
      if (iVar2 == 0) {
        uVar5 = 6;
        goto switchD_00172e8c_caseD_7;
      }
      iVar2 = strcmp(__s1,"--filter-prefix");
      if (iVar2 == 0) {
        uVar5 = 8;
        goto switchD_00172e8c_caseD_7;
      }
      switch(uVar5) {
      case 1:
        pcVar3 = this;
        break;
      case 2:
        pcVar3 = (cmCTestLaunch *)&this->OptionSource;
        break;
      case 3:
        std::__cxx11::string::assign((char *)__lhs);
        bVar1 = std::operator==(__lhs,"CXX");
        if (bVar1) {
          std::__cxx11::string::assign((char *)__lhs);
        }
        goto LAB_00172f25;
      case 4:
        pcVar3 = (cmCTestLaunch *)&this->OptionTargetName;
        break;
      case 5:
        pcVar3 = (cmCTestLaunch *)&this->OptionTargetType;
        break;
      case 6:
        pcVar3 = (cmCTestLaunch *)&this->OptionBuildDir;
        break;
      default:
        goto switchD_00172e8c_caseD_7;
      case 8:
        pcVar3 = (cmCTestLaunch *)&this->OptionFilterPrefix;
      }
      std::__cxx11::string::assign((char *)pcVar3);
LAB_00172f25:
      uVar5 = 0;
      iVar4 = 0;
    }
switchD_00172e8c_caseD_7:
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

bool cmCTestLaunch::ParseArguments(int argc, const char* const* argv)
{
  // Launcher options occur first and are separated from the real
  // command line by a '--' option.
  enum Doing
  {
    DoingNone,
    DoingOutput,
    DoingSource,
    DoingLanguage,
    DoingTargetName,
    DoingTargetType,
    DoingBuildDir,
    DoingCount,
    DoingFilterPrefix
  };
  Doing doing = DoingNone;
  int arg0 = 0;
  for (int i = 1; !arg0 && i < argc; ++i) {
    const char* arg = argv[i];
    if (strcmp(arg, "--") == 0) {
      arg0 = i + 1;
    } else if (strcmp(arg, "--output") == 0) {
      doing = DoingOutput;
    } else if (strcmp(arg, "--source") == 0) {
      doing = DoingSource;
    } else if (strcmp(arg, "--language") == 0) {
      doing = DoingLanguage;
    } else if (strcmp(arg, "--target-name") == 0) {
      doing = DoingTargetName;
    } else if (strcmp(arg, "--target-type") == 0) {
      doing = DoingTargetType;
    } else if (strcmp(arg, "--build-dir") == 0) {
      doing = DoingBuildDir;
    } else if (strcmp(arg, "--filter-prefix") == 0) {
      doing = DoingFilterPrefix;
    } else if (doing == DoingOutput) {
      this->OptionOutput = arg;
      doing = DoingNone;
    } else if (doing == DoingSource) {
      this->OptionSource = arg;
      doing = DoingNone;
    } else if (doing == DoingLanguage) {
      this->OptionLanguage = arg;
      if (this->OptionLanguage == "CXX") {
        this->OptionLanguage = "C++";
      }
      doing = DoingNone;
    } else if (doing == DoingTargetName) {
      this->OptionTargetName = arg;
      doing = DoingNone;
    } else if (doing == DoingTargetType) {
      this->OptionTargetType = arg;
      doing = DoingNone;
    } else if (doing == DoingBuildDir) {
      this->OptionBuildDir = arg;
      doing = DoingNone;
    } else if (doing == DoingFilterPrefix) {
      this->OptionFilterPrefix = arg;
      doing = DoingNone;
    }
  }

  // Extract the real command line.
  if (arg0) {
    this->RealArgC = argc - arg0;
    this->RealArgV = argv + arg0;
    for (int i = 0; i < this->RealArgC; ++i) {
      this->HandleRealArg(this->RealArgV[i]);
    }
    return true;
  }
  this->RealArgC = 0;
  this->RealArgV = nullptr;
  std::cerr << "No launch/command separator ('--') found!\n";
  return false;
}